

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

Gia_Iso2Man_t * Gia_Iso2ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Iso2Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  pGVar4 = (Gia_Iso2Man_t *)calloc(1,0x90);
  pGVar4->pGia = pGia;
  iVar1 = pGia->nObjs;
  pGVar4->nObjs = iVar1;
  piVar6 = (int *)0x0;
  pGVar4->nUniques = 0;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar2;
  lVar11 = (long)iVar2;
  if (iVar2 != 0) {
    piVar6 = (int *)malloc(lVar11 * 4);
  }
  lVar14 = (long)iVar1;
  pVVar5->pArray = piVar6;
  pVVar5->nSize = iVar1;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,lVar14 * 4);
  }
  pGVar4->vUniques = pVVar5;
  pVVar7 = Gia_Iso2ManCollectTies(pGia);
  pGVar4->vTied = pVVar7;
  uVar13 = iVar1 - 1U;
  while( true ) {
    do {
      uVar12 = uVar13;
      uVar13 = uVar12 + 1;
    } while ((uVar12 & 1) != 0);
    if (uVar13 < 9) break;
    iVar10 = 5;
    while( true ) {
      if (uVar13 % (iVar10 - 2U) == 0) break;
      uVar3 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar13 < uVar3) goto LAB_0074be98;
    }
  }
LAB_0074be98:
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar12) {
    uVar3 = uVar13;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar3;
  piVar6 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar7->pArray = piVar6;
  pVVar7->nSize = uVar13;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,(long)(int)uVar13 << 2);
  }
  pGVar4->vTable = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar7->pArray = piVar6;
  pGVar4->vPlaces = pVVar7;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  pVVar8->pArray = ppvVar9;
  pGVar4->vSingles = pVVar8;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(40000);
  pVVar7->pArray = piVar6;
  pGVar4->vVec0 = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(40000);
  pVVar7->pArray = piVar6;
  pGVar4->vVec1 = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar2;
  if (iVar2 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar11 * 4);
  }
  pVVar7->pArray = piVar6;
  pVVar7->nSize = iVar1;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,lVar14 * 4);
  }
  pGVar4->vMap0 = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar2;
  if (iVar2 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar11 << 2);
  }
  pVVar7->pArray = piVar6;
  pVVar7->nSize = iVar1;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,lVar14 << 2);
  }
  pGVar4->vMap1 = pVVar7;
  iVar1 = pGVar4->nUniques;
  pGVar4->nUniques = iVar1 + 1;
  if (0 < pVVar5->nSize) {
    *pVVar5->pArray = iVar1;
    return pGVar4;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Gia_Iso2Man_t * Gia_Iso2ManStart( Gia_Man_t * pGia )
{
    Gia_Iso2Man_t * p;
    p = ABC_CALLOC( Gia_Iso2Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 0;
    // internal data
    p->vUniques  = Vec_IntStartFull( p->nObjs );
    p->vTied     = Gia_Iso2ManCollectTies( pGia );
    p->vTable    = Vec_IntStart( Abc_PrimeCudd(1*p->nObjs) );
    p->vPlaces   = Vec_IntAlloc( 1000 );
    p->vSingles  = Vec_PtrAlloc( 1000 );
    p->vVec0     = Vec_IntAlloc( 10000 );
    p->vVec1     = Vec_IntAlloc( 10000 );
    p->vMap0     = Vec_IntStart( p->nObjs );
    p->vMap1     = Vec_IntStart( p->nObjs );
    // add constant 0 object
    Vec_IntWriteEntry( p->vUniques, 0, p->nUniques++ );
    return p;
}